

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O1

Aig_Obj_t * Dar_LibBuildBest(Dar_Man_t *p)

{
  Dar_Lib_t *pDVar1;
  Aig_Obj_t *pAVar2;
  long lVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  int Counter;
  int local_14;
  
  pDVar1 = s_DarLib;
  pVVar4 = p->vLeavesBest;
  if (0 < pVVar4->nSize) {
    lVar3 = 0;
    lVar5 = 0;
    do {
      *(void **)(pDVar1->pDatas->nLats + lVar3 + -0x15) = pVVar4->pArray[lVar5];
      lVar5 = lVar5 + 1;
      pVVar4 = p->vLeavesBest;
      lVar3 = lVar3 + 0x18;
    } while (lVar5 < pVVar4->nSize);
  }
  pDVar1 = s_DarLib;
  Dar_LibBuildClear_rec(s_DarLib->pObjs + p->OutBest,&local_14);
  pAVar2 = Dar_LibBuildBest_rec(p,pDVar1->pObjs + p->OutBest);
  return pAVar2;
}

Assistant:

Aig_Obj_t * Dar_LibBuildBest( Dar_Man_t * p )
{
    int i, Counter = 4;
    for ( i = 0; i < Vec_PtrSize(p->vLeavesBest); i++ )
        s_DarLib->pDatas[i].pFunc = (Aig_Obj_t *)Vec_PtrEntry( p->vLeavesBest, i );
    Dar_LibBuildClear_rec( Dar_LibObj(s_DarLib, p->OutBest), &Counter );
    return Dar_LibBuildBest_rec( p, Dar_LibObj(s_DarLib, p->OutBest) );
}